

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O2

int Cba_NameIsLegalInVerilog(char *pName,int NameId)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  
  if (pName != (char *)0x0) {
    cVar1 = *pName;
    iVar3 = 1;
    if (cVar1 != '\\') {
      if (cVar1 == '\0') goto LAB_0035d77d;
      if ((0xc < NameId) &&
         ((0xe5 < (byte)(cVar1 + 0x85U) || (cVar1 == '_' || (byte)(cVar1 + 0xbfU) < 0x1a)))) {
        do {
          pName = (char *)((byte *)pName + 1);
          bVar2 = *pName;
          if (bVar2 == 0) {
            return 1;
          }
        } while ((((0xf5 < (byte)(bVar2 - 0x3a)) || (0xe5 < (byte)((bVar2 & 0xdf) + 0xa5))) ||
                 (bVar2 == 0x5f)) || (bVar2 == 0x24));
      }
      iVar3 = 0;
    }
    return iVar3;
  }
LAB_0035d77d:
  __assert_fail("pName != NULL && *pName != \'\\0\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaWriteVer.c"
                ,0x15d,"int Cba_NameIsLegalInVerilog(char *, int)");
}

Assistant:

static inline int Cba_NameIsLegalInVerilog( char * pName, int NameId )
{
    // identifier ::= simple_identifier | escaped_identifier
    // simple_identifier ::= [a-zA-Z_][a-zA-Z0-9_$]
    // escaped_identifier ::= \ {Any_ASCII_character_except_white_space} white_space
    // white_space ::= space | tab | newline
    assert( pName != NULL && *pName != '\0' );
    if ( *pName == '\\' )
        return 1;
    if ( NameId < 13 ) // see PRS_VER_UNKNOWN in cbaReadVer.c
        return 0;
    if ( (*pName < 'a' || *pName > 'z') && (*pName < 'A' || *pName > 'Z') && *pName != '_' )
        return 0;
    while ( *(++pName) )
        if ( (*pName < 'a' || *pName > 'z') && (*pName < 'A' || *pName > 'Z') && (*pName < '0' || *pName > '9') && *pName != '_' && *pName != '$' ) 
            return 0;
    return 1;
}